

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::HighbdDrPredTest_SaturatedValues_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::HighbdDrPredTest_SaturatedValues_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x60);
  anon_unknown.dwarf_369d94::HighbdDrPredTest_SaturatedValues_Test::
  HighbdDrPredTest_SaturatedValues_Test((HighbdDrPredTest_SaturatedValues_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }